

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O2

string * __thiscall
LinearRegression::generateGradients_abi_cxx11_
          (string *__return_storage_ptr__,LinearRegression *this)

{
  long *plVar1;
  unsigned_long *puVar2;
  unsigned_long uVar3;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  pointer pPVar7;
  LinearRegression *this_00;
  size_t __n;
  View *pVVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  unsigned_long *puVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  pointer pPVar14;
  long lVar15;
  size_t sVar16;
  size_t sStack_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  LinearRegression *local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  string labelStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  size_t local_3a8;
  string local_3a0;
  size_t local_380;
  string local_378;
  size_t local_358;
  string local_350;
  unsigned_long *local_330;
  string errorString;
  string gradString;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  long local_2c0;
  string local_2b8;
  string local_298;
  vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
  actualGradients;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_2c8 = __return_storage_ptr__;
  __n = QueryCompiler::numberOfViews
                  ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
  std::
  vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
  ::vector(&actualGradients,__n,(allocator_type *)&gradString);
  pPVar7 = partialGradients.super__Vector_base<PartialGradient,_std::allocator<PartialGradient>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pPVar14 = partialGradients.
                 super__Vector_base<PartialGradient,_std::allocator<PartialGradient>_>._M_impl.
                 super__Vector_impl_data._M_start; pPVar14 != pPVar7; pPVar14 = pPVar14 + 1) {
    plVar1 = *(long **)&((*(pPVar14->query->_aggregates).
                           super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                           super__Vector_impl_data._M_start)->_incoming).
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl;
    gradString.field_2._8_8_ = 0;
    gradString._M_string_length = 0;
    gradString.field_2._M_allocated_capacity = 0;
    gradString._M_dataplus._M_p = (pointer)plVar1[1];
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)&gradString._M_string_length,&pPVar14->inputVariables);
    std::vector<ActualGradient,_std::allocator<ActualGradient>_>::push_back
              (actualGradients.
               super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + *plVar1,(value_type *)&gradString);
    std::
    _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~_Vector_base((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     *)&gradString._M_string_length);
  }
  offset_abi_cxx11_(&local_3a0,this,1);
  std::operator+(&local_408,&local_3a0,"void computeGradient()\n");
  pbVar13 = local_2c8;
  offset_abi_cxx11_(&local_350,this,1);
  std::operator+(&local_3c8,&local_408,&local_350);
  std::operator+(&local_450,&local_3c8,"{\n");
  offset_abi_cxx11_(&local_378,this,2);
  std::operator+(&local_430,&local_450,&local_378);
  std::operator+(&labelStr,&local_430,"memset(grad, 0, numberOfParameters * ");
  std::__cxx11::to_string(&local_2e8,8);
  std::operator+(&errorString,&labelStr,&local_2e8);
  std::operator+(&gradString,&errorString,");\n");
  std::__cxx11::string::~string((string *)&errorString);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&labelStr);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_3a0);
  offset_abi_cxx11_(&local_408,this,1);
  std::operator+(&local_3c8,&local_408,"void computeError()\n");
  offset_abi_cxx11_(&local_3a0,this,1);
  std::operator+(&local_450,&local_3c8,&local_3a0);
  std::operator+(&local_430,&local_450,"{\n");
  offset_abi_cxx11_(&local_350,this,2);
  std::operator+(&labelStr,&local_430,&local_350);
  std::operator+(&errorString,&labelStr,"error = 0.0;\n");
  std::__cxx11::string::~string((string *)&labelStr);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_408);
  sVar16 = 0;
  local_410 = this;
  do {
    if (sVar16 == __n) {
      offset_abi_cxx11_(&local_3a0,this,2);
      std::operator+(&local_408,&local_3a0,"for (size_t j = 0; j < numberOfParameters; ++j)\n");
      offset_abi_cxx11_(&local_350,this,3);
      std::operator+(&local_3c8,&local_408,&local_350);
      std::operator+(&local_450,&local_3c8,"grad[j] /= tuple.aggregates[0];\n");
      offset_abi_cxx11_(&local_378,this,1);
      std::operator+(&local_430,&local_450,&local_378);
      std::operator+(&labelStr,&local_430,"}\n\n");
      std::__cxx11::string::append((string *)&gradString);
      std::__cxx11::string::~string((string *)&labelStr);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::to_string
                (&labelStr,
                 (this->_parameterIndex).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[this->labelID]);
      offset_abi_cxx11_(&local_170,this,2);
      std::operator+(&local_150,&local_170,"error /= tuple.aggregates[0];\n\n");
      offset_abi_cxx11_(&local_190,this,2);
      std::operator+(&local_130,&local_150,&local_190);
      std::operator+(&local_110,&local_130,"double paramNorm = 0.0;\n");
      offset_abi_cxx11_(&local_1b0,this,2);
      std::operator+(&local_f0,&local_110,&local_1b0);
      std::operator+(&local_d0,&local_f0,"/* Adding the regulariser to the error */\n");
      offset_abi_cxx11_(&local_1d0,this,2);
      std::operator+(&local_b0,&local_d0,&local_1d0);
      std::operator+(&local_90,&local_b0,"for (size_t j = 1; j < numberOfParameters; ++j)\n");
      offset_abi_cxx11_(&local_1f0,this,3);
      std::operator+(&local_70,&local_90,&local_1f0);
      std::operator+(&local_50,&local_70,"paramNorm += params[j] * params[j];\n");
      offset_abi_cxx11_(&local_210,this,2);
      std::operator+(&local_2b8,&local_50,&local_210);
      std::operator+(&local_298,&local_2b8,"paramNorm -= params[");
      std::operator+(&local_2e8,&local_298,&labelStr);
      std::operator+(&local_378,&local_2e8,"] * params[");
      std::operator+(&local_350,&local_378,&labelStr);
      std::operator+(&local_3a0,&local_350,"];\n\n");
      offset_abi_cxx11_(&local_230,this,2);
      std::operator+(&local_408,&local_3a0,&local_230);
      std::operator+(&local_3c8,&local_408,"error += lambda[1] * paramNorm;\n");
      offset_abi_cxx11_(&local_250,this,1);
      std::operator+(&local_450,&local_3c8,&local_250);
      std::operator+(&local_430,&local_450,"}\n");
      std::__cxx11::string::append((string *)&errorString);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::operator+(pbVar13,&gradString,&errorString);
      std::__cxx11::string::~string((string *)&labelStr);
      std::__cxx11::string::~string((string *)&errorString);
      std::__cxx11::string::~string((string *)&gradString);
      std::
      vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
      ::~vector(&actualGradients);
      return pbVar13;
    }
    pVVar8 = QueryCompiler::getView
                       ((this->_compiler).
                        super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,sVar16)
    ;
    bVar5 = (pVVar8->_fVars).super__Base_bitset<2UL>._M_w[1] != 0;
    bVar6 = (pVVar8->_fVars).super__Base_bitset<2UL>._M_w[0] != 0;
    local_2c0 = sVar16 * 0x18;
    local_358 = 3;
    local_3a8 = sVar16;
    if (actualGradients.
        super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[sVar16].
        super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>._M_impl.
        super__Vector_impl_data._M_start !=
        actualGradients.
        super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[sVar16].
        super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (bVar5 || bVar6) {
        offset_abi_cxx11_(&local_378,this,2);
        std::operator+(&local_350,&local_378,"for (V");
        std::__cxx11::to_string(&local_2e8,local_3a8);
        std::operator+(&local_3a0,&local_350,&local_2e8);
        std::operator+(&local_408,&local_3a0,"_tuple& tuple : V");
        std::__cxx11::to_string(&local_298,local_3a8);
        std::operator+(&local_3c8,&local_408,&local_298);
        std::operator+(&local_450,&local_3c8,")\n");
        offset_abi_cxx11_(&local_2b8,this,2);
        std::operator+(&local_430,&local_450,&local_2b8);
        std::operator+(&labelStr,&local_430,"{\n");
        std::__cxx11::string::append((string *)&gradString);
        std::__cxx11::string::~string((string *)&labelStr);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_378);
        offset_abi_cxx11_(&local_378,this,2);
        std::operator+(&local_350,&local_378,"for (V");
        std::__cxx11::to_string(&local_2e8,local_3a8);
        std::operator+(&local_3a0,&local_350,&local_2e8);
        std::operator+(&local_408,&local_3a0,"_tuple& tuple : V");
        std::__cxx11::to_string(&local_298,local_3a8);
        std::operator+(&local_3c8,&local_408,&local_298);
        std::operator+(&local_450,&local_3c8,")\n");
        offset_abi_cxx11_(&local_2b8,this,2);
        std::operator+(&local_430,&local_450,&local_2b8);
        std::operator+(&labelStr,&local_430,"{\n");
        std::__cxx11::string::append((string *)&errorString);
        std::__cxx11::string::~string((string *)&labelStr);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_378);
        sStack_460 = 3;
      }
      else {
        offset_abi_cxx11_(&local_3a0,this,2);
        std::operator+(&local_408,&local_3a0,"V");
        std::__cxx11::to_string(&local_350,local_3a8);
        std::operator+(&local_3c8,&local_408,&local_350);
        std::operator+(&local_450,&local_3c8,"_tuple& tuple = V");
        std::__cxx11::to_string(&local_378,local_3a8);
        std::operator+(&local_430,&local_450,&local_378);
        std::operator+(&labelStr,&local_430,"[0];\n");
        std::__cxx11::string::append((string *)&gradString);
        std::__cxx11::string::~string((string *)&labelStr);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::string::~string((string *)&local_3a0);
        offset_abi_cxx11_(&local_3a0,this,2);
        std::operator+(&local_408,&local_3a0,"V");
        std::__cxx11::to_string(&local_350,local_3a8);
        std::operator+(&local_3c8,&local_408,&local_350);
        std::operator+(&local_450,&local_3c8,"_tuple& tuple = V");
        std::__cxx11::to_string(&local_378,local_3a8);
        std::operator+(&local_430,&local_450,&local_378);
        std::operator+(&labelStr,&local_430,"[0];\n");
        std::__cxx11::string::append((string *)&errorString);
        std::__cxx11::string::~string((string *)&labelStr);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::string::~string((string *)&local_3a0);
        sStack_460 = 2;
      }
      local_358 = sStack_460;
    }
    puVar2 = *(unsigned_long **)
              ((long)&((actualGradients.
                        super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>)._M_impl.
                      super__Vector_impl_data._M_finish + local_2c0);
    puVar12 = *(unsigned_long **)
               ((long)&((actualGradients.
                         super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>)._M_impl.
                       super__Vector_impl_data._M_start + local_2c0);
    while (pbVar13 = local_2c8, this = local_410, puVar12 != puVar2) {
      sVar16 = 1000;
      lVar15 = 8;
      local_380 = 1000;
      local_330 = puVar12;
      for (uVar11 = 0; uVar3 = local_330[1], uVar11 < (ulong)((long)(local_330[2] - uVar3) >> 4);
          uVar11 = uVar11 + 1) {
        sVar4 = *(size_t *)((uVar3 - 8) + lVar15);
        if (sVar4 != local_410->labelID) {
          if ((sVar16 != *(size_t *)(uVar3 + lVar15)) ||
             (uVar9 = local_380, sVar10 = sVar16, local_380 != sVar4)) {
            offset_abi_cxx11_(&local_430,local_410,local_358);
            std::operator+(&labelStr,&local_430,"error += ");
            std::__cxx11::string::append((string *)&errorString);
            std::__cxx11::string::~string((string *)&labelStr);
            std::__cxx11::string::~string((string *)&local_430);
            uVar9 = *(size_t *)((uVar3 - 8) + lVar15);
            sVar10 = *(size_t *)(uVar3 + lVar15);
          }
          if ((uVar9 == sVar10) && ((sVar16 != sVar10 || (uVar9 = local_380, local_380 != sVar10))))
          {
            std::__cxx11::string::append((char *)&errorString);
            uVar9 = *(ulong *)((uVar3 - 8) + lVar15);
          }
          if (((local_410->_categoricalFeatures).super__Base_bitset<2UL>._M_w[uVar9 >> 6] >>
               (uVar9 & 0x3f) & 1) == 0) {
            offset_abi_cxx11_(&local_3c8,local_410,local_358);
            std::operator+(&local_450,&local_3c8,"grad[");
            std::__cxx11::to_string
                      (&local_408,
                       (local_410->_parameterIndex).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[*(long *)((uVar3 - 8) + lVar15)]);
            std::operator+(&local_430,&local_450,&local_408);
            std::operator+(&labelStr,&local_430,"] += ");
            std::__cxx11::string::append((string *)&gradString);
            std::__cxx11::string::~string((string *)&labelStr);
            std::__cxx11::string::~string((string *)&local_430);
            std::__cxx11::string::~string((string *)&local_408);
            std::__cxx11::string::~string((string *)&local_450);
            std::__cxx11::string::~string((string *)&local_3c8);
            sVar4 = *(size_t *)((uVar3 - 8) + lVar15);
            if ((sVar16 != *(size_t *)(uVar3 + lVar15)) || (local_380 != sVar4)) {
              std::__cxx11::to_string
                        (&local_450,
                         (local_410->_parameterIndex).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[sVar4]);
              std::operator+(&local_430,"params[",&local_450);
              std::operator+(&labelStr,&local_430,"] * ");
              std::__cxx11::string::append((string *)&errorString);
              std::__cxx11::string::~string((string *)&labelStr);
              std::__cxx11::string::~string((string *)&local_430);
              pbVar13 = &local_450;
              goto LAB_0014ab62;
            }
          }
          else {
            offset_abi_cxx11_(&local_3a0,local_410,local_358);
            std::operator+(&local_408,&local_3a0,"grad[index_");
            getAttributeName_abi_cxx11_(&local_350,local_410,*(size_t *)((uVar3 - 8) + lVar15));
            std::operator+(&local_3c8,&local_408,&local_350);
            std::operator+(&local_450,&local_3c8,"[tuple.");
            getAttributeName_abi_cxx11_(&local_378,local_410,*(size_t *)((uVar3 - 8) + lVar15));
            std::operator+(&local_430,&local_450,&local_378);
            std::operator+(&labelStr,&local_430,"]] += ");
            std::__cxx11::string::append((string *)&gradString);
            std::__cxx11::string::~string((string *)&labelStr);
            std::__cxx11::string::~string((string *)&local_430);
            std::__cxx11::string::~string((string *)&local_378);
            std::__cxx11::string::~string((string *)&local_450);
            std::__cxx11::string::~string((string *)&local_3c8);
            std::__cxx11::string::~string((string *)&local_350);
            std::__cxx11::string::~string((string *)&local_408);
            std::__cxx11::string::~string((string *)&local_3a0);
            sVar4 = *(size_t *)((uVar3 - 8) + lVar15);
            if ((sVar16 != *(size_t *)(uVar3 + lVar15)) || (local_380 != sVar4)) {
              getAttributeName_abi_cxx11_(&local_408,local_410,sVar4);
              std::operator+(&local_3c8,"params[index_",&local_408);
              std::operator+(&local_450,&local_3c8,"[tuple.");
              getAttributeName_abi_cxx11_(&local_3a0,local_410,*(size_t *)((uVar3 - 8) + lVar15));
              std::operator+(&local_430,&local_450,&local_3a0);
              std::operator+(&labelStr,&local_430,"]] * ");
              std::__cxx11::string::append((string *)&errorString);
              std::__cxx11::string::~string((string *)&labelStr);
              std::__cxx11::string::~string((string *)&local_430);
              std::__cxx11::string::~string((string *)&local_3a0);
              std::__cxx11::string::~string((string *)&local_450);
              std::__cxx11::string::~string((string *)&local_3c8);
              pbVar13 = &local_408;
LAB_0014ab62:
              std::__cxx11::string::~string((string *)pbVar13);
            }
          }
          std::__cxx11::to_string(&local_450,*local_330);
          std::operator+(&local_430,"tuple.aggregates[",&local_450);
          std::operator+(&labelStr,&local_430,"] * ");
          std::__cxx11::string::append((string *)&gradString);
          std::__cxx11::string::~string((string *)&labelStr);
          std::__cxx11::string::~string((string *)&local_430);
          std::__cxx11::string::~string((string *)&local_450);
          if ((sVar16 != *(size_t *)(uVar3 + lVar15)) ||
             (uVar9 = sVar16, local_380 != *(size_t *)((uVar3 - 8) + lVar15))) {
            std::__cxx11::to_string(&local_450,*local_330);
            std::operator+(&local_430,"tuple.aggregates[",&local_450);
            std::operator+(&labelStr,&local_430,"] * ");
            std::__cxx11::string::append((string *)&errorString);
            std::__cxx11::string::~string((string *)&labelStr);
            std::__cxx11::string::~string((string *)&local_430);
            std::__cxx11::string::~string((string *)&local_450);
            uVar9 = *(ulong *)(uVar3 + lVar15);
          }
          if (((local_410->_categoricalFeatures).super__Base_bitset<2UL>._M_w[uVar9 >> 6] >>
               (uVar9 & 0x3f) & 1) == 0) {
            std::__cxx11::to_string
                      (&local_450,
                       (local_410->_parameterIndex).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9]);
            std::operator+(&local_430,"params[",&local_450);
            std::operator+(&labelStr,&local_430,"];\n");
            std::__cxx11::string::append((string *)&gradString);
            std::__cxx11::string::~string((string *)&labelStr);
            std::__cxx11::string::~string((string *)&local_430);
            std::__cxx11::string::~string((string *)&local_450);
            if ((sVar16 != *(size_t *)(uVar3 + lVar15)) ||
               (local_380 != *(size_t *)((uVar3 - 8) + lVar15))) {
              std::__cxx11::to_string
                        (&local_450,
                         (local_410->_parameterIndex).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[*(size_t *)(uVar3 + lVar15)]);
              std::operator+(&local_430,"params[",&local_450);
              std::operator+(&labelStr,&local_430,"];\n");
              std::__cxx11::string::append((string *)&errorString);
              std::__cxx11::string::~string((string *)&labelStr);
              std::__cxx11::string::~string((string *)&local_430);
              pbVar13 = &local_450;
              goto LAB_0014af40;
            }
          }
          else {
            getAttributeName_abi_cxx11_(&local_408,local_410,uVar9);
            std::operator+(&local_3c8,"params[index_",&local_408);
            std::operator+(&local_450,&local_3c8,"[tuple.");
            getAttributeName_abi_cxx11_(&local_3a0,local_410,*(size_t *)(uVar3 + lVar15));
            std::operator+(&local_430,&local_450,&local_3a0);
            std::operator+(&labelStr,&local_430,"]];\n");
            std::__cxx11::string::append((string *)&gradString);
            std::__cxx11::string::~string((string *)&labelStr);
            std::__cxx11::string::~string((string *)&local_430);
            std::__cxx11::string::~string((string *)&local_3a0);
            std::__cxx11::string::~string((string *)&local_450);
            std::__cxx11::string::~string((string *)&local_3c8);
            std::__cxx11::string::~string((string *)&local_408);
            this_00 = local_410;
            if ((sVar16 != *(size_t *)(uVar3 + lVar15)) ||
               (local_380 != *(size_t *)((uVar3 - 8) + lVar15))) {
              getAttributeName_abi_cxx11_(&local_408,local_410,*(size_t *)(uVar3 + lVar15));
              std::operator+(&local_3c8,"params[index_",&local_408);
              std::operator+(&local_450,&local_3c8,"[tuple.");
              getAttributeName_abi_cxx11_(&local_3a0,this_00,*(size_t *)(uVar3 + lVar15));
              std::operator+(&local_430,&local_450,&local_3a0);
              std::operator+(&labelStr,&local_430,"]];\n");
              std::__cxx11::string::append((string *)&errorString);
              std::__cxx11::string::~string((string *)&labelStr);
              std::__cxx11::string::~string((string *)&local_430);
              std::__cxx11::string::~string((string *)&local_3a0);
              std::__cxx11::string::~string((string *)&local_450);
              std::__cxx11::string::~string((string *)&local_3c8);
              pbVar13 = &local_408;
LAB_0014af40:
              std::__cxx11::string::~string((string *)pbVar13);
            }
          }
          sVar16 = *(size_t *)((uVar3 - 8) + lVar15);
          local_380 = *(size_t *)(uVar3 + lVar15);
        }
        lVar15 = lVar15 + 0x10;
      }
      puVar12 = local_330 + 4;
    }
    if ((bVar5 || bVar6) &&
        *(long *)((long)&((actualGradients.
                           super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>).
                         _M_impl.super__Vector_impl_data._M_start + local_2c0) !=
        *(long *)((long)&((actualGradients.
                           super__Vector_base<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<ActualGradient,_std::allocator<ActualGradient>_>).
                         _M_impl.super__Vector_impl_data._M_finish + local_2c0)) {
      offset_abi_cxx11_(&local_430,local_410,2);
      std::operator+(&labelStr,&local_430,"}\n");
      std::__cxx11::string::append((string *)&gradString);
      std::__cxx11::string::~string((string *)&labelStr);
      std::__cxx11::string::~string((string *)&local_430);
      offset_abi_cxx11_(&local_430,this,2);
      std::operator+(&labelStr,&local_430,"}\n");
      std::__cxx11::string::append((string *)&errorString);
      std::__cxx11::string::~string((string *)&labelStr);
      std::__cxx11::string::~string((string *)&local_430);
    }
    sVar16 = local_3a8 + 1;
  } while( true );
}

Assistant:

std::string LinearRegression::generateGradients()
{
    size_t numberOfViews = _compiler->numberOfViews();

    std::vector<std::vector<ActualGradient>> actualGradients(numberOfViews);
        
    for(PartialGradient& pGrad : partialGradients)
    {
        // get view and aggregate corresponding to the query
        std::pair<size_t,size_t>& viewAggPair =
            pGrad.query->_aggregates[0]->_incoming[0];
        
        // Assign to view, the aggregate and the corresponding param, grad pair
        ActualGradient ag;
        ag.aggNum = viewAggPair.second;
        ag.incVars = pGrad.inputVariables;

        actualGradients[viewAggPair.first].push_back(ag);
    }

    // TODO: *Observations:* the view with all continuous aggregates only has one tuple
    // Ideally, we would have the corresponding params in an array so this
    // computation can be vectorized ! Ideally also the gradients should be a vector !
    
    std::string gradString =  offset(1)+"void computeGradient()\n"+offset(1)+"{\n"+
        offset(2)+"memset(grad, 0, numberOfParameters * "+
        std::to_string(sizeof(double))+");\n";

    std::string errorString =  offset(1)+"void computeError()\n"+offset(1)+"{\n"+
        offset(2)+"error = 0.0;\n";
    
    for (size_t viewID = 0; viewID < numberOfViews; ++viewID)
    {
        // TODO: check if this view has at least one free variable
        // If it does not then avoid the for loop, get the tuple reference and
        // adjust the offset
        bool viewHasFreeVars = _compiler->getView(viewID)->_fVars.any();
        size_t off = 3;
        
        if (!actualGradients[viewID].empty())
        {
            if (viewHasFreeVars)
            {
                gradString += offset(2)+"for (V"+std::to_string(viewID)+
                    "_tuple& tuple : V"+std::to_string(viewID)+")\n"+offset(2)+"{\n";
                errorString += offset(2)+"for (V"+std::to_string(viewID)+
                    "_tuple& tuple : V"+std::to_string(viewID)+")\n"+offset(2)+"{\n";
            }
            else
            {
                gradString += offset(2)+"V"+std::to_string(viewID)+
                    "_tuple& tuple = V"+std::to_string(viewID)+"[0];\n";
                errorString += offset(2)+"V"+std::to_string(viewID)+
                    "_tuple& tuple = V"+std::to_string(viewID)+"[0];\n";
                off = 2;
            }
        }
        
        for (ActualGradient& ag : actualGradients[viewID])
        {
            size_t prevGradID = 1000;
            size_t prevParamID = 1000;

            // TODO: TODO: We go at great length to avoid adding errors twice
            // here, this could surely be simplified by adding each combination
            // to actualGradients only once!
            
            for (size_t i = 0; i < ag.incVars.size(); i++)
            {
                size_t& gradID = ag.incVars[i].first;
                size_t& paramID = ag.incVars[i].second;

                if (gradID == labelID)
                    continue;

                if (prevGradID != paramID || prevParamID != gradID) 
                    errorString += offset(off)+ "error += ";

                if (gradID == paramID &&
                    (prevGradID != paramID || prevParamID != gradID))
                    errorString += "0.5 * ";
                
                if (_categoricalFeatures[gradID])
                {   
                    gradString += offset(off)+"grad[index_"+getAttributeName(gradID)+
                        "[tuple."+getAttributeName(gradID)+"]] += ";

                    if (prevGradID != paramID || prevParamID != gradID)
                        errorString += "params[index_"+getAttributeName(gradID)+
                            "[tuple."+getAttributeName(gradID)+"]] * ";
                }
                else
                {
                    gradString += offset(off)+"grad["+
                        std::to_string(_parameterIndex[gradID])+"] += ";
                    
                    if (prevGradID != paramID || prevParamID != gradID)
                        errorString += "params["+
                            std::to_string(_parameterIndex[gradID])+"] * ";
                }
                
                gradString += "tuple.aggregates["+std::to_string(ag.aggNum)+"] * ";

                if (prevGradID != paramID || prevParamID != gradID)
                    errorString += "tuple.aggregates["+std::to_string(ag.aggNum)+"] * ";
            
                if (_categoricalFeatures[paramID])
                {
                    gradString += "params[index_"+getAttributeName(paramID)+
                        "[tuple."+getAttributeName(paramID)+"]];\n";
                    
                    if (prevGradID != paramID || prevParamID != gradID)
                        errorString += "params[index_"+getAttributeName(paramID)+
                            "[tuple."+getAttributeName(paramID)+"]];\n";
                }
                else
                {
                    // gradString += "param_"+getAttributeName(paramID)+";\n";
                    gradString += "params["+
                        std::to_string(_parameterIndex[paramID])+"];\n";

                    if (prevGradID != paramID || prevParamID != gradID)
                        errorString += "params["+
                            std::to_string(_parameterIndex[paramID])+"];\n";
                }

                prevGradID = gradID;
                prevParamID = paramID;
            }
        }
        if (!actualGradients[viewID].empty() && viewHasFreeVars)
        {    
            gradString += offset(2)+"}\n";
            errorString += offset(2)+"}\n";
        }
        
    }
    gradString += offset(2)+"for (size_t j = 0; j < numberOfParameters; ++j)\n"+
        offset(3)+"grad[j] /= tuple.aggregates[0];\n"+
        offset(1)+"}\n\n";

    std::string labelStr = std::to_string(_parameterIndex[labelID]);
    
    errorString +=  offset(2)+"error /= tuple.aggregates[0];\n\n"+
        offset(2)+"double paramNorm = 0.0;\n"+
        offset(2)+"/* Adding the regulariser to the error */\n"+
        offset(2)+"for (size_t j = 1; j < numberOfParameters; ++j)\n"+
        offset(3)+"paramNorm += params[j] * params[j];\n"+
        offset(2)+"paramNorm -= params["+labelStr+"] * params["+labelStr+"];\n\n"+
        offset(2)+"error += lambda[1] * paramNorm;\n"+
        offset(1)+"}\n";

    return gradString + errorString;
}